

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffComplex<KVEntryUint32>::printText
          (DiffComplex<KVEntryUint32> *this,size_t index,PrintIndent *out,char *prefix)

{
  string local_30;
  
  if (*(int *)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>.
                      _M_payload.super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                      super__Optional_payload_base<KVEntryUint32>._M_payload + 0x10) == 4) {
    local_30._M_dataplus._M_p._0_4_ =
         *(undefined4 *)
          *(char **)((long)&this->values[index].super__Optional_base<KVEntryUint32,_false,_false>.
                            _M_payload.super__Optional_payload<KVEntryUint32,_true,_false,_false>.
                            super__Optional_payload_base<KVEntryUint32>._M_payload._M_value.
                            super_KVEntry + 8);
    PrintIndent::operator()(out,0,(char (*) [5])0x1d0d6d,(uint *)&local_30);
  }
  else {
    KVEntry::extractRawBytes_abi_cxx11_(&local_30,(KVEntry *)(this->values + index),true," ");
    PrintIndent::operator()(out,0,(char (*) [5])0x1d0d6d,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }